

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void __thiscall QDir::setNameFilters(QDir *this,QStringList *nameFilters)

{
  QDirPrivate *pQVar1;
  
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1 != (QDirPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QDirPrivate>::detach_helper(&this->d_ptr);
  }
  pQVar1 = (this->d_ptr).d.ptr;
  QDirPrivate::clearCache(pQVar1,KeepMetaData);
  QArrayDataPointer<QString>::operator=(&(pQVar1->nameFilters).d,&nameFilters->d);
  return;
}

Assistant:

void QDir::setNameFilters(const QStringList &nameFilters)
{
    Q_D(QDir);
    d->clearCache(QDirPrivate::KeepMetaData);
    d->nameFilters = nameFilters;
}